

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall testing::TestResult::Failed(TestResult *this)

{
  bool bVar1;
  int iVar2;
  TestPartResult *this_00;
  TestResult *in_RDI;
  int i;
  int iVar3;
  int i_00;
  
  iVar3 = 0;
  while( true ) {
    i_00 = iVar3;
    iVar2 = total_part_count((TestResult *)0x117abd);
    if (iVar2 <= iVar3) {
      return false;
    }
    this_00 = GetTestPartResult(in_RDI,i_00);
    bVar1 = TestPartResult::failed(this_00);
    if (bVar1) break;
    iVar3 = i_00 + 1;
  }
  return true;
}

Assistant:

bool TestResult::Failed() const {
  for (int i = 0; i < total_part_count(); ++i) {
    if (GetTestPartResult(i).failed())
      return true;
  }
  return false;
}